

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_step_mask(void *pA,void *pB,void *pC,Integer nelems,Integer type)

{
  float fVar1;
  double dVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  Integer i;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  long local_30;
  
  switch(in_R8) {
  case 0x3e9:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(int *)(in_RDI + local_30 * 4) == 0) {
        *(undefined4 *)(in_RDX + local_30 * 4) = 0;
      }
      else {
        *(undefined4 *)(in_RDX + local_30 * 4) = *(undefined4 *)(in_RSI + local_30 * 4);
      }
    }
    break;
  case 0x3ea:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(long *)(in_RDI + local_30 * 8) == 0) {
        *(undefined8 *)(in_RDX + local_30 * 8) = 0;
      }
      else {
        *(undefined8 *)(in_RDX + local_30 * 8) = *(undefined8 *)(in_RSI + local_30 * 8);
      }
    }
    break;
  case 0x3eb:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      fVar1 = *(float *)(in_RDI + local_30 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        *(undefined4 *)(in_RDX + local_30 * 4) = *(undefined4 *)(in_RSI + local_30 * 4);
      }
      else {
        *(undefined4 *)(in_RDX + local_30 * 4) = 0;
      }
    }
    break;
  case 0x3ec:
    for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
      dVar2 = *(double *)(in_RDI + local_30 * 8);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        *(undefined8 *)(in_RDX + local_30 * 8) = *(undefined8 *)(in_RSI + local_30 * 8);
      }
      else {
        *(undefined8 *)(in_RDX + local_30 * 8) = 0;
      }
    }
    break;
  default:
    pnga_error(in_stack_00000170,in_stack_00000168);
    break;
  case 0x3ee:
    pnga_error(in_stack_00000170,in_stack_00000168);
    break;
  case 0x3ef:
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  return;
}

Assistant:

static void do_step_mask(void *pA, void *pB, void *pC, Integer nelems, Integer type){
  /* 
    Set vector C to vector B wherever vector A is nonzero,
    and to zero wherever vector A is zero.
  */
  Integer i;

  switch(type){
  
  case C_DBL:
    for(i = 0; i<nelems; i++) {
      if(((double*)pA)[i]!=(double)0.0) {
	((double*)pC)[i]=  ((double*)pB)[i];
      }else {
	((double*)pC)[i]=  (double)0.0;
      }
    }
    break;
  case C_DCPL:
    pnga_error(" do_step_mask called with type C_DCPL",C_DCPL);
    break;
  case C_SCPL:
    pnga_error(" do_step_mask called with type C_SCPL",C_SCPL);
    break;
  case C_INT:
    for(i = 0; i<nelems; i++){
      if(((int*)pA)[i]!=(int)0){
	((int*)pC)[i] = ((int*)pB)[i];
      }else{
	((int*)pC)[i] = (int)0;
      } 
    }
    break;
  case C_FLOAT:
    for(i = 0; i<nelems; i++){
      if(((float*)pA)[i]!=(float)0.0) { 
	((float*)pC)[i]=  ((float*)pB)[i];
      }else{
	((float*)pC)[i]=  (float)0.0;
      }
    }
    break;
  case C_LONG:
    for(i = 0; i<nelems; i++){
      if(((long *)pA)[i]!=(long)0){
	((long *)pC)[i]=  ((long *)pB)[i];
      }else{
	((long *)pC)[i]=(long)0;  
      }
    }
    break;		
  default: pnga_error(" do_step_mask: wrong data type ",type);
  }
}